

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O3

void mzd_shift_right_uint64_192(mzd_local_t *res,mzd_local_t *val,uint count)

{
  byte bVar1;
  
  bVar1 = (byte)count & 0x3f;
  res->w64[0] = val->w64[0] >> bVar1 | val->w64[1] << 0x40 - bVar1;
  bVar1 = (byte)count & 0x3f;
  res->w64[1] = val->w64[1] >> bVar1 | val->w64[2] << 0x40 - bVar1;
  res->w64[2] = val->w64[2] >> ((ulong)count & 0x3f);
  return;
}

Assistant:

void mzd_shift_right_uint64_192(mzd_local_t* res, const mzd_local_t* val, unsigned int count) {
  const unsigned int left_count = 8 * sizeof(word) - count;
  const block_t* block          = CONST_BLOCK(val, 0);
  block_t* rblock               = BLOCK(res, 0);

  rblock->w64[0] = (block->w64[0] >> count) | (block->w64[1] << left_count);
  rblock->w64[1] = (block->w64[1] >> count) | (block->w64[2] << left_count);
  rblock->w64[2] = block->w64[2] >> count;
}